

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::base::WeakPtrFactory<perfetto::ipc::Client>::WeakPtrFactory
          (WeakPtrFactory<perfetto::ipc::Client> *this,Client *owner)

{
  Client **__p;
  __shared_ptr<perfetto::ipc::Client_*,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  __p = (Client **)operator_new(8);
  *__p = owner;
  ::std::__shared_ptr<perfetto::ipc::Client*,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<perfetto::ipc::Client*,void>
            ((__shared_ptr<perfetto::ipc::Client*,(__gnu_cxx::_Lock_policy)2> *)&local_20,__p);
  std::__shared_ptr<perfetto::ipc::Client_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<perfetto::ipc::Client_*,_(__gnu_cxx::_Lock_policy)2> *)this,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

explicit WeakPtrFactory(T* owner)
      : weak_ptr_(std::shared_ptr<T*>(new T* {owner})) {
    PERFETTO_DCHECK_THREAD(thread_checker);
  }